

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

size_t Extract(string *where_from,string *where_to,size_t pos,char *delim)

{
  size_t sVar1;
  string *in_RSI;
  string *in_RDI;
  size_t end;
  string asStackY_48 [16];
  char *in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  
  sVar1 = FindFirstOfSet(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                         in_stack_ffffffffffffffc8);
  if (sVar1 == 0xffffffffffffffff) {
    std::__cxx11::string::operator=(in_RSI,in_RDI);
  }
  else {
    std::__cxx11::string::substr((ulong)asStackY_48,(ulong)in_RDI);
    std::__cxx11::string::operator=(in_RSI,asStackY_48);
    std::__cxx11::string::~string(asStackY_48);
  }
  return sVar1;
}

Assistant:

size_t Extract(const std::string& where_from, std::string& where_to, size_t pos, const char* delim)
{
    size_t end = FindFirstOfSet(where_from, pos, delim);

    if (end != std::string::npos)
        where_to = where_from.substr(pos, end - pos);
    else
        where_to = where_from;

    return end;
}